

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHandlerCommand.cxx
# Opt level: O2

bool __thiscall cmCTestHandlerCommand::CheckArgumentValue(cmCTestHandlerCommand *this,string *arg)

{
  int iVar1;
  uint uVar2;
  pointer ppcVar3;
  cmMakefile *this_00;
  cmCTest *this_01;
  ostream *poVar4;
  string local_1c0;
  ostringstream e;
  
  iVar1 = this->ArgumentDoing;
  if (iVar1 == 2) {
    this->ArgumentDoing = 0;
    uVar2 = this->ArgumentIndex;
    ppcVar3 = (this->Values).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    if (ppcVar3[uVar2] == (char *)0x0) {
      ppcVar3[uVar2] = (arg->_M_dataplus)._M_p;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar4 = std::operator<<((ostream *)&e,"Set ");
      poVar4 = std::operator<<(poVar4,(this->Arguments).
                                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar2]);
      poVar4 = std::operator<<(poVar4," to ");
      poVar4 = std::operator<<(poVar4,(string *)arg);
      std::operator<<(poVar4,"\n");
      this_01 = (this->super_cmCTestCommand).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(this_01,0,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                   ,0x124,local_1c0._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&local_1c0);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar4 = std::operator<<((ostream *)&e,"Called with more than one value for ");
      std::operator<<(poVar4,(this->Arguments).
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar2]);
      this_00 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      this->ArgumentDoing = 1;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  return iVar1 == 2;
}

Assistant:

bool cmCTestHandlerCommand::CheckArgumentValue(std::string const& arg)
{
  if (this->ArgumentDoing == ArgumentDoingKeyword) {
    this->ArgumentDoing = ArgumentDoingNone;
    unsigned int k = this->ArgumentIndex;
    if (this->Values[k]) {
      std::ostringstream e;
      e << "Called with more than one value for " << this->Arguments[k];
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      this->ArgumentDoing = ArgumentDoingError;
      return true;
    }
    this->Values[k] = arg.c_str();
    cmCTestLog(this->CTest, DEBUG, "Set " << this->Arguments[k] << " to "
                                          << arg << "\n");
    return true;
  }
  return false;
}